

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

cio_error cio_uart_get_num_stop_bits(cio_uart *port,cio_uart_num_stop_bits *num_stop_bits)

{
  undefined1 local_5c [4];
  cio_error err;
  termios tty;
  cio_uart_num_stop_bits *num_stop_bits_local;
  cio_uart *port_local;
  
  if (port == (cio_uart *)0x0) {
    port_local._4_4_ = CIO_INVALID_ARGUMENT;
  }
  else {
    tty._52_8_ = num_stop_bits;
    port_local._4_4_ = get_current_settings(port,(termios *)local_5c);
    if (port_local._4_4_ == CIO_SUCCESS) {
      if ((tty.c_iflag & 0x40) == 0x40) {
        *(undefined4 *)tty._52_8_ = 1;
      }
      else {
        *(undefined4 *)tty._52_8_ = 0;
      }
      port_local._4_4_ = CIO_SUCCESS;
    }
  }
  return port_local._4_4_;
}

Assistant:

enum cio_error cio_uart_get_num_stop_bits(const struct cio_uart *port, enum cio_uart_num_stop_bits *num_stop_bits)
{
	if (cio_unlikely(port == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	struct termios tty;
	enum cio_error err = get_current_settings(port, &tty);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		return err;
	}

	if ((tty.c_cflag & (tcflag_t)CSTOPB) == (tcflag_t)CSTOPB) {
		*num_stop_bits = CIO_UART_TWO_STOP_BITS;
	} else {
		*num_stop_bits = CIO_UART_ONE_STOP_BIT;
	}

	return CIO_SUCCESS;
}